

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls.cpp
# Opt level: O0

void __thiscall ot::commissioner::DtlsSession::Reset(DtlsSession *this)

{
  bool bVar1;
  uchar *pw;
  size_type pw_len;
  v10 *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  basic_string_view<char> bVar2;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  Error local_278;
  anon_class_1_0_00000001 local_24a;
  v10 local_249;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  char *local_240;
  string local_238;
  allocator local_211;
  string local_210;
  int local_1ec;
  undefined1 auStack_1e8 [4];
  int fail;
  anon_class_1_0_00000001 local_1da;
  v10 local_1d9;
  v10 *local_1d8;
  char *local_1d0;
  string local_1c8;
  allocator local_191;
  string local_190;
  DtlsSession *local_170;
  DtlsSession *this_local;
  undefined1 local_158 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  char *local_140;
  string *local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  char *pcStack_128;
  string *local_120;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *local_118 [3];
  undefined1 local_100 [16];
  v10 *local_f0;
  char *local_e8;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *local_e0;
  v10 *local_d8;
  char *pcStack_d0;
  string *local_c8;
  v10 *local_c0;
  v10 **local_b8;
  v10 *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  char *pcStack_90;
  DtlsSession **local_80;
  undefined1 *local_78;
  DtlsSession **local_70;
  undefined8 local_68;
  undefined1 *local_60;
  DtlsSession **local_58;
  v10 **local_50;
  v10 *local_48;
  char *pcStack_40;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> **local_38;
  undefined1 *local_30;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> **local_28;
  undefined8 local_20;
  undefined1 *local_18;
  format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> **local_10;
  
  local_170 = this;
  if (((this->mState == kConnecting) || (this->mState == kConnected)) ||
     (this->mState == kDisconnected)) {
    mbedtls_ssl_session_reset(&this->mSsl);
    this->mIsClientIdSet = false;
    bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->mPSK);
    if (!bVar1) {
      pw = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->mPSK);
      pw_len = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->mPSK);
      local_1ec = mbedtls_ssl_set_hs_ecjpake_password(&this->mSsl,pw,pw_len);
      if (local_1ec != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_210,"dtls",&local_211);
        Reset::anon_class_1_0_00000001::operator()(&local_24a);
        local_a8 = &local_248;
        local_b0 = &local_249;
        bVar2 = ::fmt::v10::operator()(local_b0);
        local_240 = (char *)bVar2.size_;
        local_248 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bVar2.data_
        ;
        ::fmt::v10::detail::
        check_format_string<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_FMT_COMPILE_STRING,_0>
                  ();
        ErrorFromMbedtlsError(&local_278,local_1ec);
        local_138 = Error::GetMessage_abi_cxx11_(&local_278);
        local_120 = &local_238;
        local_130 = local_248;
        pcStack_128 = local_240;
        local_a0 = &local_130;
        local_148 = local_248;
        local_140 = local_240;
        local_98 = local_148;
        pcStack_90 = local_140;
        this_local = (DtlsSession *)
                     ::fmt::v10::
                     make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,std::__cxx11::string_const>
                               ((format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_138,(v10 *)local_120,local_248);
        local_78 = local_158;
        local_80 = &this_local;
        local_68 = 0xd;
        fmt_00.size_ = 0xd;
        fmt_00.data_ = local_140;
        args_00.field_1.values_ = in_R9.values_;
        args_00.desc_ = (unsigned_long_long)local_80;
        local_70 = local_80;
        local_60 = local_78;
        local_58 = local_80;
        ::fmt::v10::vformat_abi_cxx11_(&local_238,(v10 *)local_148,fmt_00,args_00);
        Log(kError,&local_210,&local_238);
        std::__cxx11::string::~string((string *)&local_238);
        Error::~Error(&local_278);
        std::__cxx11::string::~string((string *)&local_210);
        std::allocator<char>::~allocator((allocator<char> *)&local_211);
      }
    }
    this->mState = kOpen;
  }
  else {
    std::allocator<char>::allocator();
    this_00 = (v10 *)0x3b262e;
    std::__cxx11::string::string((string *)&local_190,"dtls",&local_191);
    Reset::anon_class_1_0_00000001::operator()(&local_1da);
    local_b8 = &local_1d8;
    local_c0 = &local_1d9;
    bVar2 = ::fmt::v10::operator()(local_c0);
    local_1d0 = (char *)bVar2.size_;
    local_1d8 = (v10 *)bVar2.data_;
    ::fmt::v10::detail::check_format_string<void_*,_FMT_COMPILE_STRING,_0>();
    local_c8 = &local_1c8;
    local_d8 = local_1d8;
    pcStack_d0 = local_1d0;
    local_e0 = (format_arg_store<fmt::v10::basic_format_context<fmt::v10::appender,_char>,_void_*> *
               )auStack_1e8;
    local_50 = &local_d8;
    local_f0 = local_1d8;
    local_e8 = local_1d0;
    _auStack_1e8 = this;
    local_48 = local_f0;
    pcStack_40 = local_e8;
    local_118[0] = ::fmt::v10::
                   make_format_args<fmt::v10::basic_format_context<fmt::v10::appender,char>,void*>
                             (local_e0,this_00,(void **)local_c8);
    local_30 = local_100;
    local_38 = local_118;
    local_20 = 0xe;
    fmt.size_ = 0xe;
    fmt.data_ = local_e8;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_38;
    local_28 = local_38;
    local_18 = local_30;
    local_10 = local_38;
    ::fmt::v10::vformat_abi_cxx11_(&local_1c8,local_f0,fmt,args);
    Log(kWarn,&local_190,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_190);
    std::allocator<char>::~allocator((allocator<char> *)&local_191);
  }
  return;
}

Assistant:

void DtlsSession::Reset()
{
    if (mState != State::kConnecting && mState != State::kConnected && mState != State::kDisconnected)
    {
        LOG_WARN(LOG_REGION_DTLS, "session(={}) is in invalid state", static_cast<void *>(this));
        ExitNow();
    }

    mbedtls_ssl_session_reset(&mSsl);

    mIsClientIdSet = false;

    if (!mPSK.empty())
    {
        if (int fail = mbedtls_ssl_set_hs_ecjpake_password(&mSsl, mPSK.data(), mPSK.size()))
        {
            LOG_ERROR(LOG_REGION_DTLS, "reset EC-JPAKE password failed; {}", ErrorFromMbedtlsError(fail).GetMessage());
        }
    }

    mState = State::kOpen;

exit:
    return;
}